

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void Assimp::FBX::validateAnimCurveNodes
               (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                *curves,bool strictMode)

{
  AnimationCurveNode *this;
  bool bVar1;
  reference ppAVar2;
  Object *pOVar3;
  AnimationCurveNode *node;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
  *__range2;
  Object *target;
  bool strictMode_local;
  vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
  *curves_local;
  
  __range2 = (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
              *)0x0;
  __end2 = std::
           vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
           ::begin(curves);
  node = (AnimationCurveNode *)
         std::
         vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
         ::end(curves);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_Assimp::FBX::AnimationCurveNode_*const_*,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>
                                *)&node);
    if (!bVar1) {
      return;
    }
    ppAVar2 = __gnu_cxx::
              __normal_iterator<const_Assimp::FBX::AnimationCurveNode_*const_*,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>
              ::operator*(&__end2);
    this = *ppAVar2;
    if (__range2 ==
        (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
         *)0x0) {
      __range2 = (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                  *)AnimationCurveNode::Target(this);
    }
    pOVar3 = AnimationCurveNode::Target(this);
    if (pOVar3 != (Object *)__range2) {
      LogFunctions<Assimp::FBXImporter>::LogWarn("Node target is nullptr type.");
    }
    if ((strictMode) && (pOVar3 = AnimationCurveNode::Target(this), pOVar3 != (Object *)__range2))
    break;
    __gnu_cxx::
    __normal_iterator<const_Assimp::FBX::AnimationCurveNode_*const_*,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>
    ::operator++(&__end2);
  }
  __assert_fail("node->Target() == target",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                ,0xa81,
                "void Assimp::FBX::validateAnimCurveNodes(const std::vector<const AnimationCurveNode *> &, bool)"
               );
}

Assistant:

static void validateAnimCurveNodes(const std::vector<const AnimationCurveNode*>& curves,
            bool strictMode) {
            const Object* target(NULL);
            for (const AnimationCurveNode* node : curves) {
                if (!target) {
                    target = node->Target();
                }
                if (node->Target() != target) {
                    FBXImporter::LogWarn("Node target is nullptr type.");
                }
                if (strictMode) {
                    ai_assert(node->Target() == target);
                }
            }
        }